

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall AmpIO::SetMotorVoltage(AmpIO *this,uint index,uint32_t volts)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  
  if (index < this->NumMotors) {
    uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
    if (uVar2 < 8) {
      bVar1 = false;
    }
    else {
      uVar3 = (volts & 0xffff) + 0x81000000;
      if ((this->collect_state == true) && (index + 1 == (uint)this->collect_chan)) {
        uVar3 = volts & 0xffff | 0xc1000000;
      }
      uVar4 = index + this->WB_CURR_OFFSET;
      this->WriteBuffer[uVar4] = this->WriteBuffer[uVar4] & 0x30000000 | uVar3;
      bVar1 = true;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool AmpIO::SetMotorVoltage(unsigned int index, uint32_t volts)
{
    if (index >= NumMotors)
        return false;
    if (GetFirmwareVersion() < 8)
        return false;
    // Could check MotorConfig to verify that voltage control is available
    // (MCFG_VOLTAGE_CONTROL); firmware will ignore voltage command if voltage
    // control is not available.

    quadlet_t data = VALID_BIT  | (1 << 24) | (volts & DAC_MASK);
    if (collect_state && (collect_chan == (index+1)))
        data |= COLLECT_BIT;
     // Preserve any motor enable bits set by SetAmpEnable
    data |= WriteBuffer[WB_CURR_OFFSET+index]&(MOTOR_ENABLE_MASK|MOTOR_ENABLE_BIT);
    WriteBuffer[WB_CURR_OFFSET+index] = data;
    return true;
}